

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::
dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
::dispatcher_template_t
          (dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
           *this,quotes_t *quotes,disp_params_t *params)

{
  tuple<so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  in_RAX;
  pointer *__ptr;
  __uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  local_28;
  
  local_28._M_t.
  super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl =
       (tuple<so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
        )(tuple<so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
          )in_RAX.
           super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
           .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl;
  so_5::dispatcher_t::dispatcher_t((dispatcher_t *)this);
  (this->super_actual_disp_iface_t).super_dispatcher_t._vptr_dispatcher_t =
       (_func_int **)&PTR__dispatcher_template_t_00289df8;
  if ((params->m_queue_params).m_lock_factory.super__Function_base._M_manager != (_Manager_type)0x0)
  {
    (*(params->m_queue_params).m_lock_factory._M_invoker)((_Any_data *)&local_28);
    demand_queue_t::demand_queue_t(&this->m_demand_queue,(lock_unique_ptr_t *)&local_28,quotes);
    if (local_28._M_t.
        super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
        .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
         )0x0) {
      (**(code **)(*(long *)local_28._M_t.
                            super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
                            .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>.
                            _M_head_impl + 8))();
    }
    local_28._M_t.
    super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
    .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl =
         (tuple<so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
          )(_Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
            )0x0;
    (this->m_work_thread).
    super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
    .super_common_data_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>.
    m_queue = (demand_queue_t *)&this->m_demand_queue;
    (this->m_work_thread).
    super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
    .super_common_data_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>.
    m_thread._M_id._M_thread = 0;
    (this->m_work_thread).
    super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
    .super_common_data_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>.
    m_thread_id._M_thread = 0;
    stats::manually_registered_source_t::manually_registered_source_t
              ((manually_registered_source_t *)
               &(this->m_work_thread).
                super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
                .m_working_stats);
    *(undefined ***)
     &(this->m_work_thread).
      super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
      .m_working_stats = &PTR_distribute_00289e68;
    (this->m_work_thread).
    super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
    .m_working_stats.m_work_activity.m_avg_time.__r = (rep)this;
    (this->m_work_thread).
    super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
    .m_waiting_stats.super_internal_lock.m_lock.m_flag.super___atomic_flag_base._M_i = false;
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

dispatcher_template_t(
			const quotes_t & quotes,
			disp_params_t params )
			:	m_demand_queue{
					params.queue_params().lock_factory()(),
					quotes }
			,	m_work_thread{ m_demand_queue }
			,	m_data_source{ self() }
			{}